

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch_descriptorset_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::SwitchDescriptorSetPass::Process(SwitchDescriptorSetPass *this)

{
  Module *pMVar1;
  Instruction *this_00;
  pointer ppIVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  pointer ppIVar5;
  Instruction *var;
  Instruction **ppIVar6;
  initializer_list<unsigned_int> init_list;
  Status local_88;
  uint32_t local_84;
  Instruction *local_80;
  DecorationManager *local_78;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decos;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_78 = IRContext::get_decoration_mgr((this->super_Pass).context_);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar6 = (Instruction **)
            ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  pIVar4 = (Instruction *)
           ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  local_88 = SuccessWithoutChange;
  local_80 = pIVar4;
  do {
    this_00 = *ppIVar6;
    if (this_00 == pIVar4) {
      return local_88;
    }
    if (this_00->opcode_ == OpVariable) {
      uVar3 = Instruction::result_id(this_00);
      analysis::DecorationManager::GetDecorationsFor(&decos,local_78,uVar3,false);
      ppIVar2 = decos.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar5 = decos.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppIVar5 != ppIVar2;
          ppIVar5 = ppIVar5 + 1) {
        uVar3 = Instruction::GetSingleWordInOperand(*ppIVar5,1);
        if (uVar3 == 0x22) {
          uVar3 = Instruction::GetSingleWordInOperand(*ppIVar5,2);
          if (uVar3 == *(uint32_t *)&(this->super_Pass).field_0x34) {
            pIVar4 = *ppIVar5;
            local_84 = this->ds_to_;
            init_list._M_len = 1;
            init_list._M_array = &local_84;
            utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
            Instruction::SetInOperand(pIVar4,2,&local_58);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
            local_88 = SuccessWithChange;
            break;
          }
        }
      }
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&decos.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      pIVar4 = local_80;
    }
    ppIVar6 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

Pass::Status SwitchDescriptorSetPass::Process() {
  Status status = Status::SuccessWithoutChange;
  auto* deco_mgr = context()->get_decoration_mgr();

  for (Instruction& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    auto decos = deco_mgr->GetDecorationsFor(var.result_id(), false);
    for (const auto& deco : decos) {
      spv::Decoration d = spv::Decoration(deco->GetSingleWordInOperand(1u));
      if (d == spv::Decoration::DescriptorSet &&
          deco->GetSingleWordInOperand(2u) == ds_from_) {
        deco->SetInOperand(2u, {ds_to_});
        status = Status::SuccessWithChange;
        break;
      }
    }
  }
  return status;
}